

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O3

bool __thiscall
ruckig::Ruckig<1UL,_ruckig::StandardVector,_true>::validate_input<true>
          (Ruckig<1UL,_ruckig::StandardVector,_true> *this,
          InputParameter<1UL,_ruckig::StandardVector> *input,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  RuckigError *pRVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar3 = InputParameter<1UL,_ruckig::StandardVector>::validate<true>
                    (input,check_current_state_within_limits,check_target_state_within_limits);
  if (bVar3) {
    paVar1 = (input->intermediate_positions).
             super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (input->intermediate_positions).
             super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((paVar1 != paVar2) && (input->control_interface == Position)) &&
       (this->max_number_of_waypoints < (ulong)((long)paVar2 - (long)paVar1 >> 3))) {
      pRVar4 = (RuckigError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                (&local_88,
                 (long)(input->intermediate_positions).
                       super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(input->intermediate_positions).
                       super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_48,"The number of intermediate positions ",&local_88);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
      local_e8._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_e8._M_dataplus._M_p == psVar6) {
        local_e8.field_2._M_allocated_capacity = *psVar6;
        local_e8.field_2._8_8_ = plVar5[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar6;
      }
      local_e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::to_string(&local_68,this->max_number_of_waypoints);
      std::operator+(&local_a8,&local_e8,&local_68);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_c8._M_dataplus._M_p == psVar6) {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8.field_2._8_8_ = plVar5[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar6;
      }
      local_c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      RuckigError::RuckigError(pRVar4,&local_c8);
      __cxa_throw(pRVar4,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->delta_time <= 0.0) && (input->duration_discretization != Continuous)) {
      pRVar4 = (RuckigError *)__cxa_allocate_exception(0x10);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_e8,vsnprintf,0x148,"%f",SUB84(this->delta_time,0));
      std::operator+(&local_a8,"delta time (control rate) parameter ",&local_e8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_c8._M_dataplus._M_p == psVar6) {
        local_c8.field_2._M_allocated_capacity = *psVar6;
        local_c8.field_2._8_8_ = plVar5[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar6;
      }
      local_c8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      RuckigError::RuckigError(pRVar4,&local_c8);
      __cxa_throw(pRVar4,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return bVar3;
}

Assistant:

bool validate_input(const InputParameter<DOFs, CustomVector>& input, bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        if (!input.template validate<throw_validation_error>(check_current_state_within_limits, check_target_state_within_limits)) {
            return false;
        }

        if (!input.intermediate_positions.empty() && input.control_interface == ControlInterface::Position) {
            if (input.intermediate_positions.size() > max_number_of_waypoints) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("The number of intermediate positions " + std::to_string(input.intermediate_positions.size()) + " exceeds the maximum number of waypoints " + std::to_string(max_number_of_waypoints) + ".");
                }
                return false;
            }
        }

        if (delta_time <= 0.0 && input.duration_discretization != DurationDiscretization::Continuous) {
            if constexpr (throw_validation_error) {
                throw RuckigError("delta time (control rate) parameter " + std::to_string(delta_time) + " should be larger than zero.");
            }
            return false;
        }

        return true;
    }